

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

bool __thiscall QTreeWidgetItem::isFirstColumnSpanned(QTreeWidgetItem *this)

{
  QTreeView *this_00;
  undefined4 row;
  bool bVar1;
  QTreeModel *__s;
  long in_FS_OFFSET;
  QModelIndex local_50;
  undefined1 local_38 [16];
  QTreeWidgetItem *local_28;
  QTreeWidgetItem *local_20;
  
  local_20 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  __s = treeModel(this,(QTreeWidget *)0x0);
  if (__s != (QTreeModel *)0x0) {
    if (__s->headerItem == this) {
      bVar1 = false;
    }
    else {
      local_28 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTreeModel::index((QTreeModel *)local_38,(char *)__s,(int)this);
      this_00 = &this->view->super_QTreeView;
      row = local_38._0_4_;
      if (local_28 == (QTreeWidgetItem *)0x0) {
        local_50.r = -1;
        local_50.c = -1;
        local_50.i = 0;
        local_50.m.ptr = (QAbstractItemModel *)0x0;
      }
      else {
        (*local_28->_vptr_QTreeWidgetItem[0xd])(&local_50,local_28,local_38);
      }
      bVar1 = QTreeView::isFirstColumnSpanned(this_00,row,&local_50);
    }
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidgetItem::isFirstColumnSpanned() const
{
    const QTreeModel *model = treeModel();
    if (!model || this == model->headerItem)
        return false;
    const QModelIndex index = model->index(this, 0);
    return view->isFirstColumnSpanned(index.row(), index.parent());
}